

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::Net::register_custom_layer
          (Net *this,int index,layer_creator_func creator,layer_destroyer_func destroyer,
          void *userdata)

{
  NetPrivate *pNVar1;
  pointer poVar2;
  pointer pcVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  overwrite_builtin_layer_registry_entry entry;
  
  uVar5 = index & 0xfffffeff;
  if (uVar5 == index) {
    lVar6 = 0;
    fprintf(_stderr,"overwrite built-in layer type %d",index);
    fputc(10,_stderr);
    pNVar1 = this->d;
    poVar2 = (pNVar1->overwrite_builtin_layer_registry).
             super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(pNVar1->overwrite_builtin_layer_registry).
                  super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)poVar2 >> 5;
    while (bVar7 = lVar4 != 0, lVar4 = lVar4 + -1, bVar7) {
      if (*(int *)((long)&poVar2->typeindex + lVar6) == index) {
        fprintf(_stderr,"overwrite existing overwritten built-in layer index %d",index);
        fputc(10,_stderr);
        poVar2 = (this->d->overwrite_builtin_layer_registry).
                 super__Vector_base<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(layer_creator_func *)((long)&poVar2->creator + lVar6) = creator;
        *(layer_destroyer_func *)((long)&poVar2->destroyer + lVar6) = destroyer;
        *(void **)((long)&poVar2->userdata + lVar6) = userdata;
        return 0;
      }
      lVar6 = lVar6 + 0x20;
    }
    entry.typeindex = index;
    entry.creator = creator;
    entry.destroyer = destroyer;
    entry.userdata = userdata;
    std::
    vector<ncnn::overwrite_builtin_layer_registry_entry,_std::allocator<ncnn::overwrite_builtin_layer_registry_entry>_>
    ::push_back(&pNVar1->overwrite_builtin_layer_registry,&entry);
  }
  else {
    pNVar1 = this->d;
    pcVar3 = (pNVar1->custom_layer_registry).
             super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(pNVar1->custom_layer_registry).
                            super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) >> 5) <=
        (int)uVar5) {
      entry.destroyer = (layer_destroyer_func)0x0;
      entry.userdata = (void *)0x0;
      entry._0_8_ = (long)"\r\n" + 2;
      entry.creator = (layer_creator_func)0x0;
      std::
      vector<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
      ::resize(&pNVar1->custom_layer_registry,(long)(int)(uVar5 + 1),(value_type *)&entry);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pcVar3[(int)uVar5].creator != (layer_creator_func)0x0) {
      fprintf(_stderr,"overwrite existing custom layer index %d",(ulong)uVar5);
      fputc(10,_stderr);
      pcVar3 = (this->d->custom_layer_registry).
               super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    pcVar3[(int)uVar5].creator = creator;
    pcVar3[(int)uVar5].destroyer = destroyer;
    pcVar3[(int)uVar5].userdata = userdata;
  }
  return 0;
}

Assistant:

int Net::register_custom_layer(int index, layer_creator_func creator, layer_destroyer_func destroyer, void* userdata)
{
    int custom_index = index & ~LayerType::CustomBit;
    if (index == custom_index)
    {
        NCNN_LOGE("overwrite built-in layer type %d", index);

        for (size_t i = 0; i < d->overwrite_builtin_layer_registry.size(); i++)
        {
            if (d->overwrite_builtin_layer_registry[i].typeindex == index)
            {
                NCNN_LOGE("overwrite existing overwritten built-in layer index %d", index);

                d->overwrite_builtin_layer_registry[i].creator = creator;
                d->overwrite_builtin_layer_registry[i].destroyer = destroyer;
                d->overwrite_builtin_layer_registry[i].userdata = userdata;
                return 0;
            }
        }

        struct overwrite_builtin_layer_registry_entry entry = {index, creator, destroyer, userdata};
        d->overwrite_builtin_layer_registry.push_back(entry);
        return 0;
    }

    if ((int)d->custom_layer_registry.size() <= custom_index)
    {
#if NCNN_STRING
        struct custom_layer_registry_entry dummy = {"", 0, 0, 0};
#else
        struct custom_layer_registry_entry dummy = {0, 0, 0};
#endif // NCNN_STRING
        d->custom_layer_registry.resize(custom_index + 1, dummy);
    }

    if (d->custom_layer_registry[custom_index].creator)
    {
        NCNN_LOGE("overwrite existing custom layer index %d", custom_index);
    }

    d->custom_layer_registry[custom_index].creator = creator;
    d->custom_layer_registry[custom_index].destroyer = destroyer;
    d->custom_layer_registry[custom_index].userdata = userdata;
    return 0;
}